

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildCallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ArgSlot *pAVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  bVar3 = Js::OpCodeUtil::IsCallOp(newOpcode);
  if (((!bVar3) && (newOpcode != NewScObject)) && (newOpcode != NewScObjArray)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x180e,
                       "(Js::OpCodeUtil::IsCallOp(newOpcode) || newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjArray)"
                       ,
                       "Js::OpCodeUtil::IsCallOp(newOpcode) || newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjArray"
                      );
    if (!bVar3) goto LAB_004dd571;
    *puVar4 = 0;
  }
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x180f,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004dd571;
    *puVar4 = 0;
  }
  pAVar1 = (ArgSlot *)(this->m_jnReader).m_currentLocation;
  (this->m_jnReader).m_currentLocation = (byte *)(pAVar1 + 5);
  if ((this->m_jnReader).m_endLocation < pAVar1 + 5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/ByteCode/ByteCodeReader.h"
                       ,0x68,"(m_currentLocation <= m_endLocation)",
                       "m_currentLocation <= m_endLocation");
    if (!bVar3) {
LAB_004dd571:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar3) {
    DoClosureRegCheck(this,*(RegSlot *)(pAVar1 + 1));
    DoClosureRegCheck(this,*(RegSlot *)(pAVar1 + 3));
  }
  BuildCallI_Helper(this,newOpcode,offset,*(RegSlot *)(pAVar1 + 1),*(RegSlot *)(pAVar1 + 3),*pAVar1,
                    0xffff,CallFlags_None,0xffffffff);
  return;
}

Assistant:

void
IRBuilder::BuildCallI(Js::OpCode newOpcode, uint32 offset)
{
    Assert(Js::OpCodeUtil::IsCallOp(newOpcode) || newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjArray);
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutT_CallI<SizePolicy>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->Return);
        this->DoClosureRegCheck(layout->Function);
    }

    BuildCallI_Helper(newOpcode, offset, layout->Return, layout->Function, layout->ArgCount, Js::Constants::NoProfileId);
}